

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_EndProcessing
                  (PaAlsaStreamComponent *self,unsigned_long numFrames,int *xrun)

{
  snd_pcm_format_t sVar1;
  undefined8 uVar2;
  snd_pcm_t *psVar3;
  snd_pcm_uframes_t sVar4;
  long lVar5;
  undefined1 *puVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  snd_pcm_sframes_t sVar10;
  ssize_t sVar11;
  pthread_t __thread1;
  long *plVar12;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  long local_60;
  undefined1 *local_58;
  int local_50;
  int local_4c;
  int __pa_unsure_error_id;
  int i;
  uchar *buffer;
  ulong uStack_38;
  int bufsize;
  unsigned_long __vla_expr0;
  int local_28;
  PaError local_24;
  int res;
  PaError result;
  int *xrun_local;
  unsigned_long numFrames_local;
  PaAlsaStreamComponent *self_local;
  
  local_24 = 0;
  local_28 = 0;
  if (self->ready != 0) {
    plVar12 = (long *)auStack_68;
    _res = xrun;
    xrun_local = (int *)numFrames;
    numFrames_local = (unsigned_long)self;
    if ((self->canMmap == 0) &&
       (plVar12 = (long *)auStack_68, self->streamDir == StreamDirection_Out)) {
      if (self->hostInterleaved == 0) {
        uStack_38 = (ulong)(uint)self->numHostChannels;
        lVar5 = -(uStack_38 * 8 + 0xf & 0xfffffffffffffff0);
        local_58 = auStack_68 + lVar5;
        sVar1 = self->nativeFormat;
        sVar4 = self->framesPerPeriod;
        __vla_expr0 = (unsigned_long)auStack_68;
        *(undefined8 *)(auStack_68 + lVar5 + -8) = 0x11e147;
        sVar11 = (*alsa_snd_pcm_format_size)(sVar1,sVar4 + 1);
        piVar8 = xrun_local;
        puVar6 = local_58;
        buffer._4_4_ = (int)sVar11;
        ___pa_unsure_error_id = *(long *)(numFrames_local + 0x20);
        for (local_4c = 0; local_4c < *(int *)(numFrames_local + 0xc); local_4c = local_4c + 1) {
          *(long *)(local_58 + (long)local_4c * 8) = ___pa_unsure_error_id;
          ___pa_unsure_error_id = ___pa_unsure_error_id + buffer._4_4_;
        }
        uVar2 = *(undefined8 *)(numFrames_local + 0x38);
        *(undefined8 *)(auStack_68 + lVar5 + -8) = 0x11e1ae;
        local_28 = (*(code *)alsa_snd_pcm_writen)(uVar2,puVar6,piVar8);
        plVar12 = (long *)__vla_expr0;
      }
      else {
        uStack_70 = 0x11e0f8;
        sVar10 = (*alsa_snd_pcm_writei)(self->pcm,self->nonMmapBuffer,numFrames);
        local_28 = (int)sVar10;
        plVar12 = (long *)auStack_68;
      }
    }
    piVar8 = xrun_local;
    if (*(int *)(numFrames_local + 0x18) != 0) {
      psVar3 = *(snd_pcm_t **)(numFrames_local + 0x38);
      sVar4 = *(snd_pcm_uframes_t *)(numFrames_local + 0x68);
      plVar12[-1] = 0x11e1e1;
      sVar10 = (*alsa_snd_pcm_mmap_commit)(psVar3,sVar4,(snd_pcm_uframes_t)piVar8);
      local_28 = (int)sVar10;
    }
    if ((local_28 == -0x20) || (local_28 == -0x56)) {
      *_res = 1;
    }
    else {
      local_50 = local_28;
      if (local_28 < 0) {
        plVar12[-1] = 0x11e21c;
        __thread1 = pthread_self();
        plVar12[-1] = 0x11e22e;
        iVar9 = pthread_equal(__thread1,paUnixMainThread);
        iVar7 = local_50;
        if (iVar9 != 0) {
          local_60 = (long)local_50;
          plVar12[-1] = 0x11e247;
          (*alsa_snd_strerror)(iVar7);
          plVar12[-1] = 0x11e258;
          PaUtil_SetLastHostErrorInfo
                    (*(PaHostApiTypeId *)((long)plVar12 + 0xc),*plVar12,(char *)plVar12[-1]);
        }
        plVar12[-1] = 0x11e266;
        PaUtil_DebugPrint(
                         "Expression \'res\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3497\n"
                         );
        local_24 = -9999;
      }
    }
  }
  return local_24;
}

Assistant:

static PaError PaAlsaStreamComponent_EndProcessing( PaAlsaStreamComponent *self, unsigned long numFrames, int *xrun )
{
    PaError result = paNoError;
    int res = 0;

    /* @concern FullDuplex It is possible that only one direction is marked ready after polling, and processed
     * afterwards
     */
    if( !self->ready )
        goto end;

    if( !self->canMmap && StreamDirection_Out == self->streamDir )
    {
        /* Play sound */
        if( self->hostInterleaved )
            res = alsa_snd_pcm_writei( self->pcm, self->nonMmapBuffer, numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            int bufsize = alsa_snd_pcm_format_size( self->nativeFormat, self->framesPerPeriod + 1 );
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += bufsize;
            }
            res = alsa_snd_pcm_writen( self->pcm, bufs, numFrames );
        }
    }

    if( self->canMmap )
        res = alsa_snd_pcm_mmap_commit( self->pcm, self->offset, numFrames );

    if( res == -EPIPE || res == -ESTRPIPE )
    {
        *xrun = 1;
    }
    else
    {
        ENSURE_( res, paUnanticipatedHostError );
    }

end:
error:
    return result;
}